

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void parse_resp_to_str(HttpResponse *resp,char *dest)

{
  char *pcVar1;
  char *key;
  char **ppcVar2;
  size_t sVar3;
  map_iter_t mVar4;
  map_iter_t iter;
  map_iter_t local_40;
  
  snprintf(dest,10000,"HTTP/1.1 %u\r\n",(ulong)resp->status_code);
  mVar4 = map_iter_();
  local_40.node = mVar4.node;
  local_40.bucketidx = mVar4.bucketidx;
  while( true ) {
    key = map_next_(&(resp->headers).base,&local_40);
    if (key == (char *)0x0) break;
    ppcVar2 = (char **)map_get_(&(resp->headers).base,key);
    (resp->headers).ref = ppcVar2;
    pcVar1 = *ppcVar2;
    sVar3 = strlen(dest);
    snprintf(dest + sVar3,10000,"%s: %s\r\n",key,pcVar1);
  }
  sVar3 = strlen(dest);
  (dest + sVar3)[0] = '\r';
  (dest + sVar3)[1] = '\n';
  dest[sVar3 + 2] = '\0';
  strcat(dest,resp->data);
  return;
}

Assistant:

void parse_resp_to_str(HttpResponse *resp, char *dest) {
    snprintf(dest, DATA_LENGTH, "HTTP/1.1 %u"CRLF, resp->status_code);
    const char *header;
    const char *value;
    map_iter_t iter = map_iter(&resp->headers);
    while ((header = map_next(&resp->headers, &iter))) {
        value = *map_get(&resp->headers, header);
        snprintf(dest + strlen(dest), DATA_LENGTH, "%s: %s"CRLF, header, value);
    }
    strcat(dest, CRLF);
    strcat(dest, resp->data);
}